

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O1

void __thiscall Quest_Context::UsedSpell(Quest_Context *this,short id)

{
  ushort uVar1;
  bool bVar2;
  long *plVar3;
  ushort *puVar4;
  size_type *psVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int iVar6;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  uint uVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  pVar8;
  key_type local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  if ((this->quest->quest->info).disabled == false) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"usedspell","");
    local_48._8_8_ = 0;
    local_48._2_6_ = 0;
    local_48._0_2_ = id;
    pcStack_30 = std::
                 _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1075:44)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1075:44)>
               ::_M_manager;
    bVar2 = EOPlus::Context::QueryRule
                      (&this->super_Context,&local_88,
                       (function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                        *)&local_48);
    iVar6 = extraout_EDX;
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
      iVar6 = extraout_EDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      iVar6 = extraout_EDX_01;
    }
    uVar7 = 0;
    if (bVar2) {
      util::to_string_abi_cxx11_(&local_c8,(util *)(ulong)(uint)(int)id,iVar6);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x1a94ef);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_e8.field_2._M_allocated_capacity = *psVar5;
        local_e8.field_2._8_8_ = plVar3[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar5;
        local_e8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_e8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      puVar4 = (ushort *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[](&this->progress,&local_e8);
      uVar1 = *puVar4;
      *puVar4 = (ushort)(uVar1 + 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      uVar7 = (uVar1 + 1) * 0x10000;
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"usedspell","");
    local_68._8_8_ = 0;
    local_68._4_4_ = 0;
    local_68._0_4_ = (ushort)id | uVar7;
    pcStack_50 = std::
                 _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1081:37)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1081:37)>
               ::_M_manager;
    bVar2 = EOPlus::Context::TriggerRule
                      (&this->super_Context,&local_a8,
                       (function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                        *)&local_68);
    iVar6 = extraout_EDX_02;
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
      iVar6 = extraout_EDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      iVar6 = extraout_EDX_04;
    }
    if (bVar2) {
      util::to_string_abi_cxx11_(&local_c8,(util *)(ulong)(uint)(int)id,iVar6);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x1a94ef);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_e8.field_2._M_allocated_capacity = *psVar5;
        local_e8.field_2._8_8_ = plVar3[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar5;
        local_e8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_e8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      pVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
              ::equal_range(&(this->progress)._M_t,&local_e8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
      ::_M_erase_aux(&(this->progress)._M_t,(_Base_ptr)pVar8.first._M_node,
                     (_Base_ptr)pVar8.second._M_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void Quest_Context::UsedSpell(short id)
{
	if (this->quest->Disabled())
		return;

	bool check = this->QueryRule("usedspell", [id](const std::deque<util::variant>& args) { return int(args[0]) == id; });
	short amount = 0;

	if (check)
		amount = ++this->progress["usedspell/" + util::to_string(id)];

	if (this->TriggerRule("usedspell", [id, amount](const std::deque<util::variant>& args) { return int(args[0]) == id && amount >= int(args[1]); }))
		this->progress.erase("usedspell/" + util::to_string(id));
}